

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  lua_State *L_00;
  char *pcVar2;
  int local_24;
  int i;
  lua_State *L;
  char **argv_local;
  int argc_local;
  
  L_00 = luaL_newstate();
  luaL_openlibs(L_00);
  luaL_register(L_00,"bit",bitlib);
  if (argc < 2) {
    argv_local._4_4_ = 8;
  }
  else {
    lua_createtable(L_00,0,1);
    lua_pushstring(L_00,argv[1]);
    lua_rawseti(L_00,-2,0);
    lua_setfield(L_00,-0x2712,"arg");
    iVar1 = luaL_loadfile(L_00,argv[1]);
    if (iVar1 == 0) {
      for (local_24 = 2; local_24 < argc; local_24 = local_24 + 1) {
        lua_pushstring(L_00,argv[local_24]);
      }
      iVar1 = lua_pcall(L_00,argc + -2,0,0);
      if (iVar1 == 0) {
        lua_close(L_00);
        return 0;
      }
    }
    __stream = _stderr;
    pcVar2 = lua_tolstring(L_00,-1,(size_t *)0x0);
    fprintf(__stream,"Error: %s\n",pcVar2);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc,char**argv){
lua_State*L=luaL_newstate();
int i;
luaL_openlibs(L);
luaL_register(L,"bit",bitlib);
if(argc<2)return sizeof(void*);
lua_createtable(L,0,1);
lua_pushstring(L,argv[1]);
lua_rawseti(L,-2,0);
lua_setglobal(L,"arg");
if(luaL_loadfile(L,argv[1]))
goto err;
for(i=2;i<argc;i++)
lua_pushstring(L,argv[i]);
if(lua_pcall(L,argc-2,0,0)){
err:
fprintf(stderr,"Error: %s\n",lua_tostring(L,-1));
return 1;
}
lua_close(L);
return 0;
}